

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::fetchGatherArray2DOffsets
          (tcu *this,ConstPixelBufferAccess *src,Sampler *sampler,float s,float t,int depth,
          int componentNdx,IVec2 (*offsets) [4])

{
  uint uVar1;
  uint uVar2;
  WrapMode WVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  TextureChannelClass TVar7;
  int iVar8;
  int i;
  long lVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 in_register_00001244 [12];
  undefined8 uVar15;
  undefined1 auVar14 [16];
  float fVar16;
  Vector<float,_4> VVar17;
  Vec4 VVar18;
  Vector<float,_4> res;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  TextureFormat local_68;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [20];
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  auVar14._4_12_ = in_register_00001244;
  auVar14._0_4_ = (uint)t;
  uVar1 = (src->m_size).m_data[0];
  uVar2 = (src->m_size).m_data[1];
  WVar3 = sampler->wrapS;
  fVar11 = 0.0;
  if (WVar3 < WRAPMODE_LAST) {
    fVar11 = (float)(int)uVar1;
    if ((0x57U >> (WVar3 & 0x1f) & 1) == 0) {
      if (WVar3 == REPEAT_CL) {
        fVar16 = floorf(s);
        fVar11 = (s - fVar16) * fVar11;
      }
      else {
        fVar12 = s * 0.5;
        fVar16 = floorf(fVar12);
        if ((fVar12 - fVar16 != 0.5) || (NAN(fVar12 - fVar16))) {
          fVar16 = floorf(fVar12 + 0.5);
        }
        else {
          fVar16 = 0.0;
          if (((long)(fVar12 + -0.5) & 1U) != 0) {
            fVar16 = 1.0;
          }
          fVar16 = fVar12 + -0.5 + fVar16;
        }
        fVar16 = s - (fVar16 + fVar16);
        uVar10 = -(uint)(-fVar16 <= fVar16);
        fVar11 = (float)(~uVar10 & (uint)-fVar16 | (uint)fVar16 & uVar10) * fVar11;
      }
    }
    else {
      fVar11 = fVar11 * s;
    }
  }
  fVar16 = 0.0;
  WVar3 = sampler->wrapT;
  if (WVar3 < WRAPMODE_LAST) {
    fVar16 = (float)(int)uVar2;
    if ((0x57U >> (WVar3 & 0x1f) & 1) == 0) {
      if (WVar3 == REPEAT_CL) {
        fVar12 = floorf(t);
        fVar16 = (t - fVar12) * fVar16;
      }
      else {
        fVar12 = t * 0.5;
        fVar13 = floorf(fVar12);
        if ((fVar12 - fVar13 != 0.5) || (NAN(fVar12 - fVar13))) {
          fVar13 = floorf(fVar12 + 0.5);
        }
        else {
          fVar13 = 0.0;
          if (((long)(fVar12 + -0.5) & 1U) != 0) {
            fVar13 = 1.0;
          }
          fVar13 = fVar12 + -0.5 + fVar13;
        }
        uStack_b4 = in_register_00001244._0_4_;
        uStack_b0 = in_register_00001244._4_4_;
        uStack_ac = in_register_00001244._8_4_;
        fVar12 = t - (fVar13 + fVar13);
        uVar10 = -(uint)(-fVar12 <= fVar12);
        auVar14._0_4_ = (uint)fVar12 & uVar10;
        auVar14._4_4_ = uStack_b4 & (uStack_b4 ^ 0x80000000);
        auVar14._8_4_ = uStack_b0 & (uStack_b0 ^ 0x80000000);
        auVar14._12_4_ = uStack_ac & (uStack_ac ^ 0x80000000);
        fVar16 = (float)(~uVar10 & (uint)-fVar12 | auVar14._0_4_) * fVar16;
      }
    }
    else {
      fVar16 = fVar16 * t;
    }
  }
  fVar11 = floorf(fVar11 + -0.5);
  fVar16 = floorf(fVar16 + -0.5);
  *(undefined1 (*) [16])this = ZEXT416(0);
  lVar9 = 0;
  do {
    uVar15 = auVar14._8_8_;
    uVar10 = 0;
    if (sampler->wrapS < WRAPMODE_LAST) {
      uVar5 = (*offsets)[lVar9].m_data[0] + (int)fVar11;
      uVar10 = uVar5;
      switch(sampler->wrapS) {
      default:
        uVar10 = uVar1 - 1;
        if ((int)uVar5 < (int)(uVar1 - 1)) {
          uVar10 = uVar5;
        }
        if ((int)uVar5 < 0) {
          uVar10 = 0;
        }
        break;
      case CLAMP_TO_BORDER:
        uVar10 = uVar1;
        if ((int)uVar5 < (int)uVar1) {
          uVar10 = uVar5;
        }
        if ((int)uVar5 < -1) {
          uVar10 = 0xffffffff;
        }
        break;
      case REPEAT_GL:
      case REPEAT_CL:
        uVar10 = ((int)uVar5 % (int)uVar1 >> 0x1f & uVar1) + (int)uVar5 % (int)uVar1;
        break;
      case MIRRORED_ONCE:
        uVar10 = uVar1;
        if ((int)uVar5 < (int)uVar1) {
          uVar10 = uVar5;
        }
        if ((int)uVar5 < (int)-uVar1) {
          uVar10 = -uVar1;
        }
      case MIRRORED_REPEAT_GL:
        iVar8 = (int)uVar10 % (int)(uVar1 * 2);
        uVar10 = (iVar8 - uVar1) + (iVar8 >> 0x1f & uVar1 * 2);
        uVar10 = ~((int)uVar10 >> 0x1f ^ uVar10) + uVar1;
      }
    }
    if (sampler->wrapT < WRAPMODE_LAST) {
      uVar6 = (*offsets)[lVar9].m_data[1] + (int)fVar16;
      uVar5 = uVar6;
      switch(sampler->wrapT) {
      default:
        uVar5 = uVar2 - 1;
        if ((int)uVar6 < (int)(uVar2 - 1)) {
          uVar5 = uVar6;
        }
        if ((int)uVar6 < 0) {
          uVar5 = 0;
        }
        break;
      case CLAMP_TO_BORDER:
        uVar5 = uVar2;
        if ((int)uVar6 < (int)uVar2) {
          uVar5 = uVar6;
        }
        if ((int)uVar6 < -1) {
          uVar5 = 0xffffffff;
        }
        break;
      case REPEAT_GL:
      case REPEAT_CL:
        uVar5 = ((int)uVar6 % (int)uVar2 >> 0x1f & uVar2) + (int)uVar6 % (int)uVar2;
        break;
      case MIRRORED_ONCE:
        uVar5 = uVar2;
        if ((int)uVar6 < (int)uVar2) {
          uVar5 = uVar6;
        }
        if ((int)uVar6 < (int)-uVar2) {
          uVar5 = -uVar2;
        }
      case MIRRORED_REPEAT_GL:
        iVar8 = (int)uVar5 % (int)(uVar2 * 2);
        uVar5 = (iVar8 - uVar2) + (iVar8 >> 0x1f & uVar2 * 2);
        uVar5 = ~((int)uVar5 >> 0x1f ^ uVar5) + uVar2;
      }
    }
    else {
      uVar5 = 0;
    }
    local_58._0_4_ = R;
    local_58._4_4_ = SNORM_INT8;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    if (((int)uVar10 < (int)uVar1 && -1 < (int)uVar10) &&
       ((int)uVar5 < (int)uVar2 && -1 < (int)uVar5)) {
      VVar18 = lookup((ConstPixelBufferAccess *)local_58,(int)src,uVar10,uVar5);
      auVar14._0_8_ = VVar18.m_data._8_8_;
      auVar14._8_8_ = uVar15;
    }
    else {
      TVar7 = getTextureChannelClass((src->m_format).type);
      uVar15 = auVar14._8_8_;
      switch(TVar7) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        VVar17 = sampleTextureBorder<float>(&local_68,(Sampler *)src);
        auVar14._0_8_ = VVar17.m_data._8_8_;
        auVar14._8_8_ = uVar15;
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        sampleTextureBorder<int>((TextureFormat *)(local_58 + 0x10),(Sampler *)src);
        local_68.order = (ChannelOrder)(float)(int)local_58._16_4_;
        local_68.type = (ChannelType)(float)(int)uStack_44;
        fStack_60 = (float)(int)uStack_40;
        fStack_5c = (float)(int)uStack_3c;
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        sampleTextureBorder<unsigned_int>((TextureFormat *)(local_58 + 0x10),(Sampler *)src);
        auVar4._4_4_ = uStack_44;
        auVar4._0_4_ = local_58._16_4_;
        auVar4._8_4_ = uStack_40;
        auVar4._12_4_ = uStack_3c;
        auVar14 = auVar4 & _DAT_0021e5f0 | _DAT_0021e600;
        local_68.order =
             (ChannelOrder)
             (((float)((uint)local_58._16_4_ >> 0x10 | 0x53000000) - 5.497642e+11) + auVar14._0_4_);
        local_68.type =
             (ChannelType)(((float)(uStack_44 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar14._4_4_)
        ;
        fStack_60 = ((float)(uStack_40 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar14._8_4_;
        fStack_5c = ((float)(uStack_3c >> 0x10 | 0x53000000) - 5.497642e+11) + auVar14._12_4_;
        break;
      default:
        local_68.order = 0xbf800000;
        local_68.type = 0xbf800000;
        fStack_60 = -1.0;
        fStack_5c = -1.0;
      }
      local_58._0_4_ = local_68.order;
      local_58._4_4_ = local_68.type;
      local_58._8_4_ = fStack_60;
      local_58._12_4_ = fStack_5c;
    }
    VVar18.m_data[1] = 0.0;
    VVar18.m_data[0] = (float)*(uint *)(local_58 + (long)componentNdx * 4);
    *(uint *)(this + lVar9 * 4) = *(uint *)(local_58 + (long)componentNdx * 4);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  VVar18.m_data._8_8_ = auVar14._0_8_;
  return (Vec4)VVar18.m_data;
}

Assistant:

static Vec4 fetchGatherArray2DOffsets (const ConstPixelBufferAccess& src, const Sampler& sampler, float s, float t, int depth, int componentNdx, const IVec2 (&offsets)[4])
{
	DE_ASSERT(de::inBounds(componentNdx, 0, 4));

	const int		w	= src.getWidth();
	const int		h	= src.getHeight();
	const float		u	= unnormalize(sampler.wrapS, s, w);
	const float		v	= unnormalize(sampler.wrapT, t, h);
	const int		x0	= deFloorFloatToInt32(u-0.5f);
	const int		y0	= deFloorFloatToInt32(v-0.5f);

	Vec4			result;

	for (int i = 0; i < 4; i++)
	{
		const int	sampleX	= wrap(sampler.wrapS, x0 + offsets[i].x(), w);
		const int	sampleY	= wrap(sampler.wrapT, y0 + offsets[i].y(), h);
		Vec4		pixel;

		if (deInBounds32(sampleX, 0, w) && deInBounds32(sampleY, 0, h))
			pixel = lookup(src, sampleX, sampleY, depth);
		else
			pixel = lookupBorder(src.getFormat(), sampler);

		result[i] = pixel[componentNdx];
	}

	return result;
}